

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_subsample_hbd_444_32x32_avx2(uint16_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  int in_stack_00000030;
  int in_stack_00000034;
  uint16_t *in_stack_00000038;
  int in_stack_00000044;
  uint16_t *in_stack_00000048;
  
  cfl_luma_subsampling_444_hbd_avx2
            (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
             in_stack_00000030);
  return;
}

Assistant:

static inline __m256i predict_unclipped(const __m256i *input, __m256i alpha_q12,
                                        __m256i alpha_sign, __m256i dc_q0) {
  __m256i ac_q3 = _mm256_loadu_si256(input);
  __m256i ac_sign = _mm256_sign_epi16(alpha_sign, ac_q3);
  __m256i scaled_luma_q0 =
      _mm256_mulhrs_epi16(_mm256_abs_epi16(ac_q3), alpha_q12);
  scaled_luma_q0 = _mm256_sign_epi16(scaled_luma_q0, ac_sign);
  return _mm256_add_epi16(scaled_luma_q0, dc_q0);
}